

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O0

void deqp::gles3::Functional::evalTexture2DShadowProjOffsetBias
               (ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float *pfVar8;
  float fVar9;
  undefined1 local_20 [16];
  TexLookupParams *p_local;
  ShaderEvalContext *c_local;
  
  local_20._8_8_ = p;
  p_local = (TexLookupParams *)c;
  pfVar8 = tcu::Vector<float,_4>::z(c->in);
  fVar9 = *pfVar8;
  pfVar8 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(p_local + 1));
  fVar1 = *pfVar8;
  pfVar8 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(p_local + 1));
  fVar2 = *pfVar8;
  pfVar8 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(p_local + 1));
  fVar3 = *pfVar8;
  pfVar8 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(p_local + 1));
  fVar4 = *pfVar8;
  pfVar8 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(p_local + 1));
  fVar5 = *pfVar8;
  fVar6 = *(float *)local_20._8_8_;
  pfVar8 = tcu::Vector<float,_4>::x(&p_local[1].scale);
  fVar7 = *pfVar8;
  tcu::Vector<int,_3>::swizzle((Vector<int,_3> *)local_20,(int)local_20._8_8_ + 4,0);
  fVar9 = texture2DShadowOffset
                    (c,fVar9 / fVar1,fVar2 / fVar3,fVar4 / fVar5,fVar6 + fVar7,(IVec2 *)local_20);
  pfVar8 = tcu::Vector<float,_4>::x(&p_local[10].scale);
  *pfVar8 = fVar9;
  return;
}

Assistant:

static void		evalTexture2DShadowProjOffsetBias	(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color.x() = texture2DShadowOffset(c, c.in[0].z()/c.in[0].w(), c.in[0].x()/c.in[0].w(), c.in[0].y()/c.in[0].w(), p.lod+c.in[1].x(), p.offset.swizzle(0,1)); }